

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_shr8_ins_i64(TCGContext_conflict1 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,int64_t shift)

{
  TCGv_i64 ret;
  ulong arg2;
  uintptr_t o;
  
  arg2 = (ulong)(0xff >> ((byte)shift & 0x1f)) * 0x101010101010101;
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_shri_i64_aarch64(tcg_ctx,ret,a,shift);
  tcg_gen_andi_i64_aarch64(tcg_ctx,ret,ret,arg2);
  tcg_gen_andi_i64_aarch64(tcg_ctx,d,d,~arg2);
  tcg_gen_or_i64_aarch64(tcg_ctx,d,d,ret);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_shr8_ins_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, int64_t shift)
{
    uint64_t mask = dup_const(MO_8, 0xff >> shift);
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_shri_i64(tcg_ctx, t, a, shift);
    tcg_gen_andi_i64(tcg_ctx, t, t, mask);
    tcg_gen_andi_i64(tcg_ctx, d, d, ~mask);
    tcg_gen_or_i64(tcg_ctx, d, d, t);
    tcg_temp_free_i64(tcg_ctx, t);
}